

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStmComp * __thiscall
CTcParser::parse_compound
          (CTcParser *this,int *err,int skip_lbrace,int need_rbrace,CTPNStmSwitch *enclosing_switch,
          int use_enclosing_scope)

{
  bool bVar1;
  tc_toktyp_t tVar2;
  CTcTokenizer *this_00;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  CTcParser *in_RDI;
  int in_R9D;
  CTPNStmComp *comp_stm;
  int done;
  int skip_rbrace;
  CTPNStm *cur_stm;
  CTPNStm *last_stm;
  CTPNStm *first_stm;
  tcprs_scope_t scope_data;
  long linenum;
  CTcTokFileDesc *file;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  bool bVar3;
  CTcTokenizer *in_stack_ffffffffffffff58;
  CTcTokenizer *this_01;
  CTPNStmComp *in_stack_ffffffffffffff60;
  CTPNStmBase *local_68;
  CTPNStmBase *local_60;
  CTPNStmBase *local_58;
  CTcPrsSymtab *local_50;
  int in_stack_ffffffffffffffc4;
  CTPNStmSwitch *in_stack_ffffffffffffffc8;
  CTcTokFileDesc *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  CTcTokenizer::get_last_pos
            (G_tok,(CTcTokFileDesc **)&stack0xffffffffffffffd0,(long *)&stack0xffffffffffffffc8);
  if ((in_EDX != 0) && (tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x266e7a), tVar2 == TOKT_LBRACE))
  {
    CTcTokenizer::next(in_stack_ffffffffffffff58);
  }
  if (in_R9D == 0) {
    enter_scope(in_RDI,(tcprs_scope_t *)&local_50);
  }
  local_58 = (CTPNStmBase *)0x0;
  local_60 = (CTPNStmBase *)0x0;
  bVar1 = false;
  bVar3 = false;
  while (!bVar3) {
    tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x266ef4);
    if (tVar2 == TOKT_EOF) {
      if (in_ECX == 0) {
        bVar3 = true;
        local_68 = (CTPNStmBase *)0x0;
        bVar1 = false;
      }
      else {
        CTcTokenizer::log_error(0x2b22);
        local_68 = (CTPNStmBase *)0x0;
        bVar3 = true;
      }
    }
    else if (tVar2 == TOKT_RBRACE) {
      bVar3 = true;
      local_68 = (CTPNStmBase *)0x0;
      bVar1 = true;
    }
    else {
      local_68 = &parse_stm((CTcParser *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                            &in_stack_ffffffffffffffd0->index_,in_stack_ffffffffffffffc8,
                            in_stack_ffffffffffffffc4)->super_CTPNStmBase;
      if (*in_RSI != 0) {
        bVar3 = true;
      }
    }
    if (local_68 != (CTPNStmBase *)0x0) {
      if (local_60 == (CTPNStmBase *)0x0) {
        local_58 = local_68;
      }
      else {
        CTPNStmBase::set_next_stm(local_60,(CTPNStm *)local_68);
      }
      local_60 = local_68;
    }
  }
  if (local_58 == (CTPNStmBase *)0x0) {
    in_stack_ffffffffffffff60 = (CTPNStmComp *)CTcPrsAllocObj::operator_new(0x266fef);
    CTPNStmNull::CTPNStmNull
              ((CTPNStmNull *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  }
  this_00 = (CTcTokenizer *)CTcPrsAllocObj::operator_new(0x267039);
  CTPNStmComp::CTPNStmComp
            (in_stack_ffffffffffffff60,(CTPNStm *)this_00,
             (CTcPrsSymtab *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  this_01 = this_00;
  if (this_00 != (CTcTokenizer *)0x0) {
    CTPNStmBase::set_source_pos
              ((CTPNStmBase *)this_00,in_stack_ffffffffffffffd0,(long)in_stack_ffffffffffffffc8);
    bVar3 = false;
    if (in_R9D == 0) {
      bVar3 = in_RDI->local_symtab_ != local_50;
    }
    CTPNStmCompBase::set_has_own_scope((CTPNStmCompBase *)this_00,(uint)bVar3);
  }
  if (bVar1) {
    CTcTokenizer::next(this_01);
  }
  if (in_R9D == 0) {
    leave_scope(in_RDI,(tcprs_scope_t *)&local_50);
  }
  return (CTPNStmComp *)this_00;
}

Assistant:

CTPNStmComp *CTcParser::parse_compound(
    int *err, int skip_lbrace, int need_rbrace,
    CTPNStmSwitch *enclosing_switch, int use_enclosing_scope)
{
    /* save the current line information for later */
    CTcTokFileDesc *file;
    long linenum;
    G_tok->get_last_pos(&file, &linenum);

    /* skip the '{' if we're on one and the caller wants us to */
    if (skip_lbrace && G_tok->cur() == TOKT_LBRACE)
        G_tok->next();

    /* enter a scope */
    tcprs_scope_t scope_data;
    if (!use_enclosing_scope)
        enter_scope(&scope_data);

    /* we don't have any statements in our sublist yet */
    CTPNStm *first_stm = 0;
    CTPNStm *last_stm = 0;
    CTPNStm *cur_stm = 0;

    /* presume we won't find the closing brace */
    int skip_rbrace = FALSE;

    /* keep going until we reach the closing '}' */
    for (int done = FALSE ; !done ; )
    {
        /* check what we've found */
        switch (G_tok->cur())
        {
        case TOKT_RBRACE:
            /* it's our closing brace - we're done */
            done = TRUE;
            cur_stm = 0;

            /* note that we must still skip the closing brace */
            skip_rbrace = TRUE;

            /* stop scanning statements */
            break;

        case TOKT_EOF:
            /* 
             *   if we're at end of file, and we don't need a right brace to
             *   end the block, consider this the end of the block 
             */
            if (!need_rbrace)
            {
                done = TRUE;
                cur_stm = 0;
                skip_rbrace = FALSE;
                break;
            }
            else
            {
                /* it's an error */
                G_tok->log_error(TCERR_EOF_IN_CODE);
                cur_stm = 0;
                done = TRUE;
                break;
            }
            break;

        default:
            /* parse a statement */
            cur_stm = parse_stm(err, enclosing_switch, FALSE);

            /* if an error occurred, stop parsing */
            if (*err)
                done = TRUE;
            break;
        }

        /* if we parsed a statement, add it to our list */
        if (cur_stm != 0)
        {
            /* link the statement at the end of our list */
            if (last_stm != 0)
                last_stm->set_next_stm(cur_stm);
            else
                first_stm = cur_stm;
            last_stm = cur_stm;
        }
    }

    /* if there's no statement, make the body a null statement */
    if (first_stm == 0)
        first_stm = new CTPNStmNull();

    /* build the compound statement node */
    CTPNStmComp *comp_stm = new CTPNStmComp(first_stm, local_symtab_);

    /* set some additional information if we created a statement */
    if (comp_stm != 0)
    {
        /* set the statement's line to the start of the compound */
        comp_stm->set_source_pos(file, linenum);

        /* note whether or not we have our own private scope */
        comp_stm->set_has_own_scope(!use_enclosing_scope
                                    && (local_symtab_
                                        != scope_data.local_symtab));
    }

    /* if necessary, skip the closing brace */
    if (skip_rbrace)
        G_tok->next();

    /* leave the local scope */
    if (!use_enclosing_scope)
        leave_scope(&scope_data);

    /* return the compound statement object */
    return comp_stm;
}